

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTestsUtil.cpp
# Opt level: O2

string * __thiscall
vkt::image::getShaderImageType_abi_cxx11_
          (string *__return_storage_ptr__,image *this,TextureFormat *format,ImageType imageType,
          bool multisample)

{
  TextureChannelClass TVar1;
  uint uVar2;
  char *__s;
  string imageTypePart;
  string formatPart;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  TVar1 = tcu::getTextureChannelClass(*(ChannelType *)(this + 4));
  if (TVar1 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    __s = "u";
  }
  else {
    TVar1 = tcu::getTextureChannelClass(*(ChannelType *)(this + 4));
    __s = "";
    if (TVar1 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      __s = "i";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,__s,(allocator<char> *)&local_80);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  uVar2 = (uint)format;
  if ((char)imageType == '\0') {
    if (7 < uVar2) goto LAB_006e1055;
  }
  else if ((uVar2 != 3) && (uVar2 != 2)) goto LAB_006e1055;
  std::__cxx11::string::assign((char *)&local_80);
LAB_006e1055:
  std::operator+(&local_60,&local_40,"image");
  std::operator+(__return_storage_ptr__,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderImageType (const tcu::TextureFormat& format, const ImageType imageType, const bool multisample)
{
	std::string formatPart = tcu::getTextureChannelClass(format.type) == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER ? "u" :
							 tcu::getTextureChannelClass(format.type) == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER   ? "i" : "";

	std::string imageTypePart;
	if (multisample)
	{
		switch (imageType)
		{
			case IMAGE_TYPE_2D:			imageTypePart = "2DMS";			break;
			case IMAGE_TYPE_2D_ARRAY:	imageTypePart = "2DMSArray";	break;

			default:
				DE_ASSERT(false);
		}
	}
	else
	{
		switch (imageType)
		{
			case IMAGE_TYPE_1D:			imageTypePart = "1D";			break;
			case IMAGE_TYPE_1D_ARRAY:	imageTypePart = "1DArray";		break;
			case IMAGE_TYPE_2D:			imageTypePart = "2D";			break;
			case IMAGE_TYPE_2D_ARRAY:	imageTypePart = "2DArray";		break;
			case IMAGE_TYPE_3D:			imageTypePart = "3D";			break;
			case IMAGE_TYPE_CUBE:		imageTypePart = "Cube";			break;
			case IMAGE_TYPE_CUBE_ARRAY:	imageTypePart = "CubeArray";	break;
			case IMAGE_TYPE_BUFFER:		imageTypePart = "Buffer";		break;

			default:
				DE_ASSERT(false);
		}
	}

	return formatPart + "image" + imageTypePart;
}